

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  ostream *poVar5;
  istream *piVar6;
  long *plVar7;
  invalid_argument *this;
  void *this_00;
  long in_RSI;
  int in_EDI;
  uint uVar8;
  uint uVar9;
  rep_conflict rVar10;
  duration<double,_std::ratio<1L,_1L>_> elapsed;
  time_point finish;
  time_point start;
  int sweepRate;
  vector<bool,_std::allocator<bool>_> succ;
  stringstream ssc;
  bool correlatedErrors;
  stringstream ssg;
  bool greedy;
  int timeout;
  string sweepSchedule;
  int sweepLimit;
  string latticeType;
  int rounds;
  double q;
  double p;
  int l;
  int i;
  undefined1 in_stack_00000b52;
  undefined1 in_stack_00000b53;
  int in_stack_00000b54;
  string *in_stack_00000b58;
  int in_stack_00000b64;
  double in_stack_00000b68;
  double in_stack_00000b70;
  int in_stack_00000b78;
  int in_stack_00000b7c;
  string *in_stack_00000b90;
  int in_stack_00000ba8;
  char *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9fc;
  int iVar11;
  undefined4 in_stack_fffffffffffffa04;
  size_type in_stack_fffffffffffffa08;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffa10;
  reference local_4d8;
  reference local_4c8;
  rep local_4b8;
  duration<double,_std::ratio<1L,_1L>_> local_4b0;
  undefined8 local_4a8;
  string local_4a0 [32];
  string local_480 [72];
  undefined8 local_438;
  int local_42c;
  allocator local_3f9;
  string local_3f8 [32];
  stringstream local_3d8 [399];
  bool local_249 [8];
  allocator local_241;
  string local_240 [32];
  stringstream local_220 [399];
  bool local_91;
  int local_90;
  allocator local_89;
  string local_88 [32];
  int local_68;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  if (in_EDI < 0xb) {
    local_8 = in_EDI;
    poVar5 = std::operator<<((ostream *)&std::cout,"Fewer than eleven arguments");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (local_14 = 0; local_14 < local_8; local_14 = local_14 + 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Argument ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,*(char **)(local_10 + (long)local_14 * 8));
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    local_4 = 1;
  }
  else {
    local_18 = atoi(*(char **)(in_RSI + 8));
    local_20 = atof(*(char **)(local_10 + 0x10));
    local_28 = atof(*(char **)(local_10 + 0x18));
    local_2c = atoi(*(char **)(local_10 + 0x20));
    pcVar1 = *(char **)(local_10 + 0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,pcVar1,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_68 = atoi(*(char **)(local_10 + 0x30));
    pcVar1 = *(char **)(local_10 + 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,pcVar1,&local_89);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_90 = atoi(*(char **)(local_10 + 0x40));
    pcVar1 = *(char **)(local_10 + 0x48);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,pcVar1,&local_241);
    _Var4 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_220,local_240,_Var4);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    piVar6 = (istream *)std::istream::operator>>((istream *)local_220,std::boolalpha);
    plVar7 = (long *)std::istream::operator>>(piVar6,&local_91);
    bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
    if ((bVar2 & 1) == 0) {
      pcVar1 = *(char **)(local_10 + 0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f8,pcVar1,&local_3f9);
      _Var4 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3d8,local_3f8,_Var4);
      std::__cxx11::string::~string(local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
      piVar6 = (istream *)std::istream::operator>>((istream *)local_3d8,std::boolalpha);
      plVar7 = (long *)std::istream::operator>>(piVar6,local_249);
      bVar2 = std::ios::operator!((ios *)((long)plVar7 + *(long *)(*plVar7 + -0x18)));
      if ((bVar2 & 1) == 0) {
        std::vector<bool,_std::allocator<bool>_>::vector
                  ((vector<bool,_std::allocator<bool>_> *)0x12d6fc);
        local_42c = atoi(*(char **)(local_10 + 0x58));
        local_438 = std::chrono::_V2::system_clock::now();
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                in_stack_fffffffffffff9e8);
        if (!bVar3) {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                                  in_stack_fffffffffffff9e8);
          if (!bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
                                    ,in_stack_fffffffffffff9e8);
            if (!bVar3) {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff9f4,
                                                  in_stack_fffffffffffff9f0),
                                      in_stack_fffffffffffff9e8);
              if (!bVar3) {
                this = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument(this,"Invalid lattice type.");
                __cxa_throw(this,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
            }
          }
        }
        std::__cxx11::string::string(local_480,local_88);
        std::__cxx11::string::string(local_4a0,local_50);
        uVar9 = local_249[0] & 1;
        uVar8 = local_91 & 1;
        iVar11 = local_42c;
        oneRun(in_stack_00000b7c,in_stack_00000b78,in_stack_00000b70,in_stack_00000b68,
               in_stack_00000b64,in_stack_00000b58,in_stack_00000b54,in_stack_00000b90,
               (bool)in_stack_00000b53,(bool)in_stack_00000b52,in_stack_00000ba8);
        std::vector<bool,_std::allocator<bool>_>::operator=
                  ((vector<bool,_std::allocator<bool>_> *)CONCAT44(in_stack_fffffffffffffa04,iVar11)
                   ,(vector<bool,_std::allocator<bool>_> *)CONCAT44(in_stack_fffffffffffff9fc,uVar9)
                  );
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x12d8fb);
        std::__cxx11::string::~string(local_4a0);
        std::__cxx11::string::~string(local_480);
        local_4a8 = std::chrono::_V2::system_clock::now();
        local_4b8 = (rep)std::chrono::operator-
                                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff9fc,uVar9),
                                    (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff9f4,uVar8));
        std::chrono::duration<double,std::ratio<1l,1l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<double,_std::ratio<1L,_1L>_> *)
                   CONCAT44(in_stack_fffffffffffffa04,iVar11),
                   (duration<long,_std::ratio<1L,_1000000000L>_> *)
                   CONCAT44(in_stack_fffffffffffff9fc,uVar9));
        local_4c8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_4c8);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,bVar3);
        poVar5 = std::operator<<(poVar5,", ");
        local_4d8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_4d8);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar3);
        poVar5 = std::operator<<(poVar5,", ");
        rVar10 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_4b0);
        this_00 = (void *)std::ostream::operator<<(poVar5,rVar10);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
        local_249[1] = true;
        local_249[2] = false;
        local_249[3] = false;
        local_249[4] = false;
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x12db7a);
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect argument provided (boolean).");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_249[1] = true;
        local_249[2] = false;
        local_249[3] = false;
        local_249[4] = false;
      }
      std::__cxx11::stringstream::~stringstream(local_3d8);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,"Incorrect argument provided (boolean).");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_249[1] = true;
      local_249[2] = false;
      local_249[3] = false;
      local_249[4] = false;
    }
    std::__cxx11::stringstream::~stringstream(local_220);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_50);
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 11)
    {
        std::cout << "Fewer than eleven arguments" << std::endl;
        for (int i = 0; i < argc; ++i)
        {
            std::cout << "Argument " << i << " = " << argv[i] << std::endl;
        }
        return 1;
    }

    int l = std::atoi(argv[1]);
    double p = std::atof(argv[2]);
    double q = std::atof(argv[3]);
    // std::string sweepDir(argv[4]);
    int rounds = std::atoi(argv[4]);
    std::string latticeType(argv[5]);
    int sweepLimit = std::atoi(argv[6]);
    std::string sweepSchedule(argv[7]);
    int timeout = std::atoi(argv[8]);
    bool greedy;
    std::stringstream ssg(argv[9]);
    if (!(ssg >> std::boolalpha >> greedy))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    bool correlatedErrors;
    std::stringstream ssc(argv[10]);
    if (!(ssc >> std::boolalpha >> correlatedErrors))
    {
        std::cerr << "Incorrect argument provided (boolean)." << std::endl;
        return 1;
    }
    std::vector<bool> succ;
    int sweepRate = std::atoi(argv[11]);

    auto start = std::chrono::high_resolution_clock::now();
    // if (latticeType == "rhombic_toric")
    // {
    //     succ = runToric(l, rounds, p, q, sweepDir, timeout, greedy, correlatedErrors);
    // }
    // else if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries")
    if (latticeType == "rhombic_boundaries" || latticeType == "cubic_boundaries" || latticeType == "rhombic_toric" || latticeType == "cubic_toric")
    {
        // succ = runBoundaries(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors);
        succ = oneRun(l, rounds, p, q, sweepLimit, sweepSchedule, timeout, latticeType, greedy, correlatedErrors, sweepRate);
    }
    else
    {
        throw std::invalid_argument("Invalid lattice type.");
    }
    auto finish = std::chrono::high_resolution_clock::now();
    std::chrono::duration<double> elapsed = finish - start;

    std::cout << succ[0] << ", " // Decoding succeeded
              << succ[1] << ", " // Clean syndrome
              << elapsed.count() // "s" <<
              << std::endl;

    return 0;
}